

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

void __thiscall TCV::visit(TCV *this,Call *node)

{
  bool bVar1;
  ASTNode *this_00;
  string *psVar2;
  Variable *this_01;
  int *piVar3;
  string nodeName;
  string local_60 [2];
  
  this_00 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  psVar2 = AST::ASTNode::getName_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)local_60,(string *)psVar2);
  bVar1 = isFuncCall(&node->super_ASTNode);
  if (bVar1) {
    handleChainCalls(this,local_60,&node->super_ASTNode);
  }
  else {
    bVar1 = isCalledOnObject(&node->super_ASTNode);
    if (!bVar1) {
      bVar1 = isCalledOnFunction(&node->super_ASTNode);
      if (!bVar1) {
        this_01 = getAvailableVar(this,local_60);
        bVar1 = isCalledWithDimension(&node->super_ASTNode);
        if (bVar1) {
          checkIfArrayCalledWithRightDimensions(this,this_01,local_60,&node->super_ASTNode);
        }
        else {
          Variable::getType_abi_cxx11_(this_01);
          std::__cxx11::string::_M_assign((string *)&this->returnType);
          piVar3 = AST::ASTNode::getLineNumber(this_00);
          this->position = *piVar3;
        }
        goto LAB_00126f0b;
      }
    }
    checkIfClassVariableCalledWithRightAccess(this,local_60,&node->super_ASTNode);
  }
LAB_00126f0b:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void TCV::visit(Call *node) {
    auto _node = node->getChild(0);
    auto nodeName = _node->getName();

    try {
        if (isFuncCall(node)) {

            handleChainCalls(nodeName, node);
            return;
        } else {
            if (isCalledOnObject(node) || isCalledOnFunction(node)) {
                checkIfClassVariableCalledWithRightAccess(nodeName, node);
                return;
            }
        }

        const Variable *variable = getAvailableVar(nodeName);
        if (isCalledWithDimension(node)) {
            checkIfArrayCalledWithRightDimensions(variable, nodeName, node);
            return;
        }

        returnType = variable->getType();
        position = _node->getLineNumber();
    } catch (Semantic::Error &error) {
        detector->addError(error.what());
        return;
    }
}